

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O1

optional<supermap::KeyValue<char,_char>_> __thiscall
supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_int,_void,_char>::find
          (SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_int,_void,_char> *this,
          char *pattern,function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)> *less,
          function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)> *equal)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  KeyValue<char,_char> middleElem;
  KeyValue<char,_char> firstLeqElem;
  KeyValue<char,_char> local_3c;
  KeyValue<char,_char> local_3a;
  char *local_38;
  
  local_38 = pattern;
  uVar4 = (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_int,_void>).
            super_IndexedStorage<supermap::KeyValue<char,_char>,_int,_void>.
            super_OrderedStorage<supermap::KeyValue<char,_char>,_int,_void>._vptr_OrderedStorage[1])
                    ();
  uVar6 = 0;
  if (uVar4 != 0) {
    uVar4 = (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_int,_void>).
              super_IndexedStorage<supermap::KeyValue<char,_char>,_int,_void>.
              super_OrderedStorage<supermap::KeyValue<char,_char>,_int,_void>._vptr_OrderedStorage
              [1])(this);
    if (1 < (int)uVar4) {
      uVar6 = 0;
      do {
        uVar7 = (int)(uVar6 + uVar4) / 2;
        iVar5 = (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_int,_void>).
                  super_IndexedStorage<supermap::KeyValue<char,_char>,_int,_void>.
                  super_OrderedStorage<supermap::KeyValue<char,_char>,_int,_void>.
                  _vptr_OrderedStorage[4])(this,(ulong)uVar7);
        local_3c = SUB42(iVar5,0);
        if ((less->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0013ffa2;
        bVar3 = (*less->_M_invoker)((_Any_data *)less,&local_3c,local_38);
        uVar1 = uVar4;
        uVar2 = uVar7;
        if (!bVar3) {
          if ((equal->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0013ffa2;
          bVar3 = (*equal->_M_invoker)((_Any_data *)equal,&local_3c,local_38);
          uVar1 = uVar7;
          uVar2 = uVar6;
          if (bVar3) {
            uVar1 = uVar4;
            uVar2 = uVar7;
          }
        }
        uVar6 = uVar2;
        uVar4 = uVar1;
      } while (1 < (int)(uVar4 - uVar6));
    }
    uVar4 = (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_int,_void>).
              super_IndexedStorage<supermap::KeyValue<char,_char>,_int,_void>.
              super_OrderedStorage<supermap::KeyValue<char,_char>,_int,_void>._vptr_OrderedStorage
              [1])(this);
    if ((int)uVar6 < (int)uVar4) {
      iVar5 = (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_int,_void>).
                super_IndexedStorage<supermap::KeyValue<char,_char>,_int,_void>.
                super_OrderedStorage<supermap::KeyValue<char,_char>,_int,_void>._vptr_OrderedStorage
                [4])(this,(ulong)uVar6);
      local_3a = SUB42(iVar5,0);
      if ((equal->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0013ffa2:
        std::__throw_bad_function_call();
      }
      bVar3 = (*equal->_M_invoker)((_Any_data *)equal,&local_3a,local_38);
      uVar6 = (uint)bVar3;
      uVar4 = (uint)(ushort)local_3a;
    }
    else {
      uVar6 = 0;
    }
  }
  return (_Optional_base<supermap::KeyValue<char,_char>,_true,_true>)
         ((uint3)uVar4 & 0xffff | (uint3)(uVar6 << 0x10));
}

Assistant:

std::optional<T> find(
        const FindPattern &pattern,
        std::function<bool(const T &, const FindPattern &)> less,
        std::function<bool(const T &, const FindPattern &)> equal
    ) override {
        if (getItemsCount() == 0) {
            return std::nullopt;
        }
        IndexT firstLeq = 0;
        IndexT lastGt = getItemsCount();
        while (lastGt - firstLeq > 1) {
            IndexT middle = (firstLeq + lastGt) / 2;
            T middleElem = get(middle);
            if (less(middleElem, pattern) || equal(middleElem, pattern)) {
                firstLeq = middle;
            } else {
                lastGt = middle;
            }
        }
        if (firstLeq >= getItemsCount()) {
            return std::nullopt;
        }
        T firstLeqElem = get(firstLeq);
        return equal(firstLeqElem, pattern) ? std::optional{firstLeqElem} : std::nullopt;
    }